

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall CLI::App::add_subcommand(App *this,App_p *subcom)

{
  bool bVar1;
  undefined8 uVar2;
  App *this_00;
  element_type *peVar3;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar4;
  __shared_ptr *in_RSI;
  App *in_RDI;
  string *mstrg;
  App *ckapp;
  App *in_stack_000000b8;
  App *in_stack_000000c0;
  App *in_stack_000000c8;
  value_type *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  string *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  App *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffbc;
  IncorrectConstruction *in_stack_ffffffffffffffc0;
  
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
    uVar2 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    IncorrectConstruction::IncorrectConstruction
              (in_stack_ffffffffffffffc0,(string *)CONCAT44(in_stack_ffffffffffffffbc,uVar5));
    __cxa_throw(uVar2,&IncorrectConstruction::typeinfo,IncorrectConstruction::~IncorrectConstruction
               );
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e84e8);
  this_00 = in_RDI;
  if ((bVar1) && (in_RDI->parent_ != (App *)0x0)) {
    this_00 = _get_fallthrough_parent(in_stack_ffffffffffffffa0);
  }
  std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this_00);
  _compare_subcommand_names_abi_cxx11_(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e854f);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1e85f9);
    peVar3->parent_ = in_RDI;
    std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::push_back
              ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
               this_00,in_stack_ffffffffffffff48);
    this_01 = &std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
               back((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     *)this_00)->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    return peVar4;
  }
  uVar2 = __cxa_allocate_exception(0x38);
  ::std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  OptionAlreadyAdded::OptionAlreadyAdded
            ((OptionAlreadyAdded *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __cxa_throw(uVar2,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
}

Assistant:

CLI11_INLINE App *App::add_subcommand(CLI::App_p subcom) {
    if(!subcom)
        throw IncorrectConstruction("passed App is not valid");
    auto *ckapp = (name_.empty() && parent_ != nullptr) ? _get_fallthrough_parent() : this;
    const auto &mstrg = _compare_subcommand_names(*subcom, *ckapp);
    if(!mstrg.empty()) {
        throw(OptionAlreadyAdded("subcommand name or alias matches existing subcommand: " + mstrg));
    }
    subcom->parent_ = this;
    subcommands_.push_back(std::move(subcom));
    return subcommands_.back().get();
}